

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O3

uri * __thiscall jsoncons::uri::base(uri *__return_storage_ptr__,uri *this)

{
  pointer pcVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined4 local_38;
  undefined4 uStack_30;
  
  pcVar1 = (this->uri_string_)._M_dataplus._M_p;
  uVar2 = (this->scheme_part_).first;
  uVar3 = (this->userinfo_part_).first;
  uVar4 = (this->host_part_).first;
  uVar5 = (this->port_part_).first;
  uVar6 = (this->path_part_).first;
  local_38 = (undefined4)((this->host_part_).second - uVar4);
  uStack_30 = SUB84(pcVar1 + uVar4,0);
  uri(__return_storage_ptr__,(this->scheme_part_).second - uVar2,pcVar1 + uVar2,
      (this->userinfo_part_).second - uVar3,pcVar1 + uVar3,uVar6,local_38,uStack_30,
      (this->port_part_).second - uVar5,pcVar1 + uVar5,(this->path_part_).second - uVar6,
      pcVar1 + uVar6,0,0,0,0);
  return __return_storage_ptr__;
}

Assistant:

uri base() const noexcept 
        { 
            return uri{uri_encoded_part, scheme(), encoded_userinfo(), host(), port(), encoded_path(), 
                jsoncons::string_view{}, jsoncons::string_view{}};
        }